

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O2

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::addNeighbor
          (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data,int index)

{
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *newNode;
  string asStack_48 [32];
  
  newNode = (node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  (newNode->data)._M_dataplus._M_p = (pointer)&(newNode->data).field_2;
  (newNode->data)._M_string_length = 0;
  (newNode->data).field_2._M_local_buf[0] = '\0';
  newNode->next =
       (node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  std::__cxx11::string::string(asStack_48,(string *)data);
  std::__cxx11::string::_M_assign((string *)newNode);
  std::__cxx11::string::~string(asStack_48);
  SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add(this->adjacencyList + index,newNode);
  return;
}

Assistant:

void Graph<T>::addNeighbor(T data, int index)
{
  node<T>* newNode = new node<T>();
  newNode -> setData(data);
  adjacencyList[index].add(newNode);
}